

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int get_twopass_worst_quality
              (AV1_COMP *cpi,double av_frame_err,double inactive_zone,int av_target_bandwidth)

{
  int iVar1;
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (av_target_bandwidth < 1) {
    iVar8 = (cpi->rc).worst_quality;
  }
  else {
    dVar11 = 0.9999;
    if (inactive_zone <= 0.9999) {
      dVar11 = inactive_zone;
    }
    piVar3 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar3 = &(cpi->common).mi_params.MBs;
    }
    dVar11 = (double)(~-(ulong)(inactive_zone < 0.0) & (ulong)dVar11);
    uVar7 = *piVar3 - (int)((double)*piVar3 * dVar11);
    uVar5 = 1;
    if (1 < (int)uVar7) {
      uVar5 = (ulong)uVar7;
    }
    iVar8 = (cpi->oxcf).rc_cfg.under_shoot_pct;
    iVar9 = (cpi->oxcf).rc_cfg.over_shoot_pct;
    if (iVar8 < iVar9) {
      iVar9 = iVar8;
    }
    if ((int)uVar7 < 500) {
      dVar13 = 0.925;
    }
    else {
      dVar13 = *(double *)(&DAT_00457d10 + (ulong)(3000 < (int)uVar7) * 8);
    }
    dVar14 = (double)(cpi->oxcf).speed * 0.005 + 0.975;
    dVar12 = 1.02;
    if (dVar14 <= 1.02) {
      dVar12 = dVar14;
    }
    pAVar2 = cpi->ppi;
    iVar8 = (pAVar2->twopass).rolling_arf_group_target_bits;
    if ((0 < iVar8 && 0 < (pAVar2->p_rc).total_actual_bits) && (pAVar2->p_rc).bits_off_target != 0)
    {
      dVar15 = (double)(100 - iVar9) / 200.0;
      dVar14 = 0.2;
      if (0.2 <= dVar15) {
        dVar14 = dVar15;
      }
      dVar15 = 1.0 - dVar14;
      dVar14 = dVar14 + 1.0;
      iVar9 = (pAVar2->p_rc).rate_error_estimate;
      dVar16 = (double)(pAVar2->twopass).rolling_arf_group_actual_bits;
      dVar17 = (double)iVar8;
      if (dVar16 <= dVar17) {
        dVar16 = 1.0 - (dVar17 - dVar16) / dVar17;
      }
      else {
        dVar17 = (dVar16 - dVar17) / dVar17;
        dVar16 = 1.0;
        if (dVar17 <= 1.0) {
          dVar16 = dVar17;
        }
        dVar16 = dVar16 + 1.0;
      }
      dVar17 = dVar14;
      if (dVar16 <= dVar14) {
        dVar17 = dVar16;
      }
      dVar16 = dVar15;
      if (dVar15 <= dVar17) {
        dVar16 = dVar17;
      }
      if ((dVar16 < 1.0 && -1 < iVar9) || (iVar9 < 1 && 1.0 < dVar16)) {
        dVar16 = dVar16 * (pAVar2->twopass).bpm_factor;
        if (dVar16 <= dVar14) {
          dVar14 = dVar16;
        }
        if (dVar15 <= dVar14) {
          dVar15 = dVar14;
        }
        (pAVar2->twopass).bpm_factor = dVar15;
      }
    }
    bit_depth = ((cpi->common).seq_params)->bit_depth;
    dVar14 = (pAVar2->twopass).bpm_factor;
    iVar9 = (cpi->rc).best_quality;
    iVar8 = (cpi->rc).worst_quality;
    while (iVar6 = iVar8, iVar9 < iVar6) {
      iVar1 = iVar9 + iVar6;
      iVar8 = iVar1 >> 1;
      dVar15 = q_div_term[iVar1 >> 5];
      dVar16 = q_div_term[(long)(iVar1 >> 5) + 1];
      dVar17 = pow(av_frame_err / (1.0 - dVar11),0.9);
      dVar10 = av1_convert_qindex_to_q(iVar8,bit_depth);
      dVar10 = (((dVar17 * 1250000.0) /
                ((double)(int)(CONCAT44(iVar1 >> 0x1f,iVar8) % 0x10) * (dVar16 - dVar15) * 0.0625 +
                dVar15)) * dVar13 * dVar12 * dVar14) / dVar10;
      uVar4 = (ulong)dVar10;
      if (((ulong)(uint)av_target_bandwidth << 9) / uVar5 <
          ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4)) {
        iVar9 = iVar8 + 1;
        iVar8 = iVar6;
      }
    }
    iVar8 = iVar9;
    if (((cpi->oxcf).rc_cfg.mode == AOM_CQ) && (iVar8 = (cpi->oxcf).rc_cfg.cq_level, iVar8 < iVar9))
    {
      iVar8 = iVar9;
    }
  }
  return iVar8;
}

Assistant:

static int get_twopass_worst_quality(AV1_COMP *cpi, const double av_frame_err,
                                     double inactive_zone,
                                     int av_target_bandwidth) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  inactive_zone = fclamp(inactive_zone, 0.0, 0.9999);

  if (av_target_bandwidth <= 0) {
    return rc->worst_quality;  // Highest value allowed
  } else {
    const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                            ? cpi->initial_mbs
                            : cpi->common.mi_params.MBs;
    const int active_mbs = AOMMAX(1, num_mbs - (int)(num_mbs * inactive_zone));
    const double av_err_per_mb = av_frame_err / (1.0 - inactive_zone);
    const uint64_t target_norm_bits_per_mb =
        ((uint64_t)av_target_bandwidth << BPER_MB_NORMBITS) / active_mbs;
    int rate_err_tol = AOMMIN(rc_cfg->under_shoot_pct, rc_cfg->over_shoot_pct);
    const double size_factor =
        (active_mbs < 500) ? 0.925 : ((active_mbs > 3000) ? 1.05 : 1.0);
    const double speed_factor =
        AOMMIN(1.02, (0.975 + (0.005 * cpi->oxcf.speed)));

    // Update bpm correction factor based on previous GOP rate error.
    twopass_update_bpm_factor(cpi, rate_err_tol);

    // Try and pick a max Q that will be high enough to encode the
    // content at the given rate.
    int q = find_qindex_by_rate_with_correction(
        target_norm_bits_per_mb, cpi->common.seq_params->bit_depth,
        av_err_per_mb,
        cpi->ppi->twopass.bpm_factor * speed_factor * size_factor,
        rc->best_quality, rc->worst_quality);

    // Restriction on active max q for constrained quality mode.
    if (rc_cfg->mode == AOM_CQ) q = AOMMAX(q, rc_cfg->cq_level);
    return q;
  }
}